

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ssl_tls.c
# Opt level: O2

int tls_prf_sha256(uchar *secret,size_t slen,char *label,uchar *random,size_t rlen,uchar *dstbuf,
                  size_t dlen)

{
  byte bVar1;
  int iVar2;
  mbedtls_md_info_t *md_info;
  size_t __n;
  uchar *output;
  ulong uVar3;
  ulong uVar4;
  ulong uVar5;
  ulong ilen;
  uchar *input;
  uchar local_a8 [8];
  uchar h_i [32];
  undefined1 local_68 [8];
  mbedtls_md_context_t md_ctx;
  
  mbedtls_md_init((mbedtls_md_context_t *)local_68);
  md_info = mbedtls_md_info_from_type(MBEDTLS_MD_SHA256);
  if (md_info == (mbedtls_md_info_t *)0x0) {
    iVar2 = -0x6c00;
  }
  else {
    h_i._24_8_ = slen;
    bVar1 = mbedtls_md_get_size(md_info);
    ilen = (ulong)bVar1;
    __n = strlen(label);
    md_ctx.hmac_ctx = (void *)(rlen + __n + ilen);
    output = (uchar *)calloc(1,(size_t)md_ctx.hmac_ctx);
    if (output == (uchar *)0x0) {
      iVar2 = -0x7f00;
    }
    else {
      input = output + ilen;
      memcpy(input,label,__n);
      memcpy(input + __n,random,rlen);
      iVar2 = mbedtls_md_setup((mbedtls_md_context_t *)local_68,md_info,1);
      if ((((iVar2 == 0) &&
           (iVar2 = mbedtls_md_hmac_starts((mbedtls_md_context_t *)local_68,secret,h_i._24_8_),
           iVar2 == 0)) &&
          (iVar2 = mbedtls_md_hmac_update((mbedtls_md_context_t *)local_68,input,rlen + __n),
          iVar2 == 0)) &&
         (iVar2 = mbedtls_md_hmac_finish((mbedtls_md_context_t *)local_68,output), iVar2 == 0)) {
        uVar5 = 0;
        while (((((iVar2 = 0, uVar5 < dlen &&
                  (iVar2 = mbedtls_md_hmac_reset((mbedtls_md_context_t *)local_68), iVar2 == 0)) &&
                 ((iVar2 = mbedtls_md_hmac_update
                                     ((mbedtls_md_context_t *)local_68,output,
                                      (size_t)md_ctx.hmac_ctx), iVar2 == 0 &&
                  ((iVar2 = mbedtls_md_hmac_finish((mbedtls_md_context_t *)local_68,local_a8),
                   iVar2 == 0 &&
                   (iVar2 = mbedtls_md_hmac_reset((mbedtls_md_context_t *)local_68), iVar2 == 0)))))
                 ) && (iVar2 = mbedtls_md_hmac_update((mbedtls_md_context_t *)local_68,output,ilen),
                      iVar2 == 0)) &&
               (iVar2 = mbedtls_md_hmac_finish((mbedtls_md_context_t *)local_68,output), iVar2 == 0)
               )) {
          uVar5 = uVar5 + ilen;
          uVar4 = ilen;
          if (dlen < uVar5) {
            uVar4 = dlen % ilen;
          }
          for (uVar3 = 0; uVar4 != uVar3; uVar3 = uVar3 + 1) {
            dstbuf[uVar3] = local_a8[uVar3];
          }
          dstbuf = dstbuf + ilen;
        }
      }
    }
    mbedtls_md_free((mbedtls_md_context_t *)local_68);
    if (output != (uchar *)0x0) {
      mbedtls_platform_zeroize(output,(size_t)md_ctx.hmac_ctx);
    }
    mbedtls_platform_zeroize(local_a8,0x20);
    free(output);
  }
  return iVar2;
}

Assistant:

MBEDTLS_CHECK_RETURN_CRITICAL
static int tls_prf_sha256(const unsigned char *secret, size_t slen,
                          const char *label,
                          const unsigned char *random, size_t rlen,
                          unsigned char *dstbuf, size_t dlen)
{
    return tls_prf_generic(MBEDTLS_MD_SHA256, secret, slen,
                           label, random, rlen, dstbuf, dlen);
}